

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk74(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk74 *peVar1;
  int local_2c;
  int i;
  envy_bios_power_unk74 *unk74;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk74;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk74.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse LOW POWER table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).unk74.version);
    }
    else {
      fprintf((FILE *)out,"LOW POWER table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).unk74.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).unk74.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; local_2c < (int)(uint)(bios->power).unk74.entriesnum;
          local_2c = local_2c + 1) {
        envy_bios_dump_hex(bios,out,(bios->power).unk74.entries[local_2c].offset,
                           (uint)(bios->power).unk74.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk74(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk74 *unk74 = &bios->power.unk74;
	int i;

	if (!unk74->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk74->valid) {
		fprintf(out, "Failed to parse LOW POWER table at 0x%x, version %x\n", unk74->offset, unk74->version);
		return;
	}

	fprintf(out, "LOW POWER table at 0x%x, version %x\n", unk74->offset, unk74->version);
	envy_bios_dump_hex(bios, out, unk74->offset, unk74->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk74->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk74->entries[i].offset, unk74->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}